

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type TVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  Descriptor *descriptor;
  long *plVar4;
  string *psVar5;
  size_type *psVar6;
  int i;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  char *pcVar7;
  BytesMode in_R8D;
  BytesMode BVar8;
  undefined1 in_R9B;
  undefined1 drop_list;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)printer);
  io::Printer::Print(printer,"    case $num$:\n","num",&local_b0);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    psVar5 = &local_b0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar5,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
               in_R8D,(bool)in_R9B);
    io::Printer::Print(printer,
                       "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
                       ,"name",psVar5);
    options_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      options_00 = extraout_RDX_00;
    }
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)this_00,options_00,(FieldDescriptor *)psVar5);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)this_01,options_01,(FieldDescriptor *)psVar5);
    io::Printer::Print(printer,
                       "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$"
                       ,"keyReaderFn",&local_b0,"valueReaderFn",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    TVar3 = FieldDescriptor::type(this_01);
    if (TVar3 == TYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_b0,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,descriptor);
      io::Printer::Print(printer,", $messageType$.deserializeBinaryFromReader","messageType",
                         &local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    io::Printer::Print(printer,");\n");
    io::Printer::Print(printer,"         });\n");
    goto LAB_00226642;
  }
  BVar8 = 0x22644a;
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
    TVar3 = FieldDescriptor::type(field);
    pcVar7 = "Message";
    if (TVar3 == TYPE_GROUP) {
      pcVar7 = "Group";
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar7,pcVar7 + (ulong)(TVar3 != TYPE_GROUP) * 2 + 5);
    TVar3 = FieldDescriptor::type(field);
    if (TVar3 == TYPE_GROUP) {
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar4[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    }
    BVar8 = 0x355a64;
    psVar5 = &local_90;
    io::Printer::Print(printer,
                       "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                       ,"fieldclass",&local_b0,"msgOrGroup",psVar5,"grpfield",&local_70);
    drop_list = SUB81(psVar5,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((TVar3 == TYPE_GROUP) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_00226573:
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,true,true,true,BVar8);
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,bVar2);
    BVar8 = 0x37c672;
    psVar5 = &local_90;
    io::Printer::Print(printer,
                       "      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                       "fieldtype",&local_b0,"reader",psVar5);
    drop_list = SUB81(psVar5,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00226573;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((*(int *)(field + 0x4c) != 3) || (bVar2 = FieldDescriptor::is_packed(field), bVar2)) {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar8,(bool)drop_list);
    io::Printer::Print(printer,"      msg.set$name$(value);\n","name",&local_b0);
  }
  else {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x1,BVar8,(bool)drop_list);
    io::Printer::Print(printer,"      msg.add$name$(value);\n","name",&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_00226642:
  io::Printer::Print(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {

  printer->Print("    case $num$:\n",
                 "num", SimpleItoa(field->number()));

  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print("        jspb.Map.deserializeBinary(message, reader, "
                   "$keyReaderFn$, $valueReaderFn$",
          "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
          "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
        "fieldclass", SubmessageTypeRef(options, field),
          "msgOrGroup", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                        "Group" : "Message",
          "grpfield", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                      (SimpleItoa(field->number()) + ", ") : "");
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype", JSFieldTypeAnnotation(options, field, false, true,
                                             /* singular_if_not_packed */ true,
                                             BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_repeated() && !field->is_packed()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print(
          "      msg.set$name$(value);\n",
          "name", JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}